

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O2

int64_t primesum::pi_lmo4(int64_t x)

{
  ulong uVar1;
  ulong *puVar2;
  long *plVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer plVar7;
  int64_t b;
  long lVar8;
  long lVar9;
  size_type __n;
  long lVar10;
  pointer pcVar11;
  long lVar12;
  long lVar13;
  int128_t *piVar14;
  int128_t *piVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int64_t iVar20;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong low;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int128_t *__return_storage_ptr__;
  long lVar24;
  bool bVar25;
  double dVar26;
  undefined1 in_stack_fffffffffffffe38 [16];
  vector<int,_std::allocator<int>_> primes;
  int256_t phi;
  ulong local_160;
  ulong local_158;
  vector<char,_std::allocator<char>_> sieve;
  vector<long,_std::allocator<long>_> next;
  vector<int,_std::allocator<int>_> mu;
  vector<__int128,_std::allocator<__int128>_> phi_1;
  vector<int,_std::allocator<int>_> lpf;
  int256_t s1;
  int256_t p2;
  
  if (x < 2) {
    iVar20 = 0;
  }
  else {
    dVar26 = get_alpha_lmo((primesum *)x,(int128_t)in_stack_fffffffffffffe38);
    lVar8 = iroot<3,long>(x);
    __return_storage_ptr__ = (int128_t *)(long)((double)lVar8 * dVar26);
    if ((long)__return_storage_ptr__ < 0xd) {
      lVar8 = (long)*(int *)(PhiTiny::pi + (long)__return_storage_ptr__ * 4);
    }
    else {
      lVar8 = 6;
    }
    P2(&p2,(primesum *)x,(int128_t)in_stack_fffffffffffffe38,0,(int)__return_storage_ptr__);
    generate_moebius(&mu,(int64_t)__return_storage_ptr__);
    generate_lpf(&lpf,(int64_t)__return_storage_ptr__);
    generate_primes(&primes,(int64_t)__return_storage_ptr__);
    S1(&s1,(primesum *)x,(int128_t)in_stack_fffffffffffffe38,0,(int64_t)__return_storage_ptr__,
       (int)lVar8);
    uVar17 = x / (long)__return_storage_ptr__ + 1;
    lVar9 = isqrt<long>(uVar17);
    __n = next_power_of_2<long>(lVar9);
    lVar10 = pi_bsearch<int,long>(&primes,(long)__return_storage_ptr__);
    std::vector<char,_std::allocator<char>_>::vector(&sieve,__n,(allocator_type *)&phi);
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<long,std::allocator<long>> *)&next,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,(allocator_type *)&phi);
    phi.low._0_8_ = 0;
    phi.low._8_8_ = 0;
    std::vector<__int128,_std::allocator<__int128>_>::vector
              (&phi_1,(long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&phi,
               (allocator_type *)&stack0xfffffffffffffe47);
    phi.high._0_8_ = 0;
    phi.high._8_8_ = 0;
    phi.low._0_8_ = 0;
    phi.low._8_8_ = 0;
    local_158 = 0;
    lVar9 = 0;
    if (0 < lVar8) {
      lVar9 = lVar8;
    }
    lVar23 = -1;
    local_160 = 0;
    low = 1;
    while (pcVar11 = sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start, (long)low <= x / (long)__return_storage_ptr__
          ) {
      for (; pcVar11 !=
             sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish; pcVar11 = pcVar11 + 1) {
        *pcVar11 = '\x01';
      }
      uVar1 = low + __n;
      uVar21 = uVar1;
      if ((long)uVar17 < (long)uVar1) {
        uVar21 = uVar17;
      }
      for (lVar12 = 1; lVar12 != lVar9 + 1; lVar12 = lVar12 + 1) {
        iVar4 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar12];
        for (lVar18 = next.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12]; lVar18 < (long)uVar21;
            lVar18 = lVar18 + iVar4) {
          sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18 + lVar23] = '\0';
        }
        next.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] = lVar18;
      }
      BinaryIndexedTree::init<std::vector<char,std::allocator<char>>>
                ((BinaryIndexedTree *)&phi,&sieve,low);
      lVar12 = lVar8;
      while (lVar12 = lVar12 + 1, lVar12 < lVar10) {
        iVar4 = primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar12];
        lVar24 = (long)iVar4;
        lVar13 = x / (long)(uVar21 * lVar24);
        lVar18 = (long)__return_storage_ptr__ / lVar24;
        if ((long)__return_storage_ptr__ / lVar24 < lVar13) {
          lVar18 = lVar13;
        }
        piVar14 = (int128_t *)(x / (long)(low * lVar24));
        iVar20 = x % (long)(low * lVar24);
        if ((long)__return_storage_ptr__ <= (long)piVar14) {
          piVar14 = __return_storage_ptr__;
        }
        if ((long)piVar14 <= lVar24) break;
        lVar13 = (long)piVar14 * lVar24;
        for (; lVar18 < (long)piVar14; piVar14 = (int128_t *)((long)piVar14 + -1)) {
          if ((mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)piVar14] != 0) &&
             (iVar4 < lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar14])) {
            piVar15 = BinaryIndexedTree::sum
                                ((int128_t *)&phi,(BinaryIndexedTree *)(x / lVar13 - low),x % lVar13
                                );
            uVar19 = (long)piVar15 +
                     *(ulong *)(phi_1.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar12);
            uVar22 = mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar14] * lVar13;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar19;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar22;
            iVar20 = SUB168(auVar5 * auVar6,8);
            uVar16 = SUB168(auVar5 * auVar6,0);
            bVar25 = local_158 < uVar16;
            local_158 = local_158 - uVar16;
            local_160 = (local_160 -
                        (uVar22 * (extraout_RDX +
                                   *(long *)((long)phi_1.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                            lVar12 * 0x10 + 8) +
                                  (ulong)CARRY8((ulong)piVar15,
                                                *(ulong *)(phi_1.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar12
                                                  ))) + ((long)uVar22 >> 0x3f) * uVar19 + iVar20)) -
                        (ulong)bVar25;
          }
          lVar13 = lVar13 - lVar24;
        }
        piVar14 = BinaryIndexedTree::sum
                            ((int128_t *)&phi,(BinaryIndexedTree *)(~low + uVar21),iVar20);
        plVar7 = next.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = (ulong *)(phi_1.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12);
        uVar16 = *puVar2;
        *puVar2 = *puVar2 + (long)piVar14;
        plVar3 = (long *)((long)phi_1.super__Vector_base<__int128,_std::allocator<__int128>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar12 * 0x10 + 8);
        *plVar3 = *plVar3 + extraout_RDX_00 + (ulong)CARRY8(uVar16,(ulong)piVar14);
        for (lVar18 = next.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12]; lVar18 < (long)uVar21;
            lVar18 = lVar18 + lVar24 * 2) {
          if (sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar18 + lVar23] != '\0') {
            sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18 + lVar23] = '\0';
            BinaryIndexedTree::update((BinaryIndexedTree *)&phi,lVar18,low);
          }
        }
        plVar7[lVar12] = lVar18;
      }
      lVar23 = lVar23 - __n;
      low = uVar1;
    }
    std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base
              ((_Vector_base<__int128,_std::allocator<__int128>_> *)&phi);
    std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base
              (&phi_1.super__Vector_base<__int128,_std::allocator<__int128>_>);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&next.super__Vector_base<long,_std::allocator<long>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&sieve.super__Vector_base<char,_std::allocator<char>_>);
    uVar17 = (long)local_160 >> 0x3f;
    phi.high._0_8_ = (ulong)s1.high + uVar17;
    phi.high._8_8_ = uVar17 + s1.high._8_8_ + (ulong)CARRY8((ulong)s1.high,uVar17);
    phi.low._0_8_ = local_158 + (ulong)s1.low;
    phi.low._8_8_ = local_160 + s1.low._8_8_ + (ulong)CARRY8(local_158,(ulong)s1.low);
    if (CARRY8(local_160,s1.low._8_8_) ||
        CARRY8(local_160 + s1.low._8_8_,(ulong)CARRY8(local_158,(ulong)s1.low))) {
      bVar25 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar25;
    }
    prime_sum_tiny(__return_storage_ptr__,phi.low._8_8_);
    int256_t::operator+((int256_t *)&next,&phi,(__int128)in_stack_fffffffffffffe38);
    int256_t::operator-((int256_t *)&sieve,(int256_t *)&next,1);
    iVar20 = (long)sieve.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)p2.low;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primes.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lpf.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&mu.super__Vector_base<int,_std::allocator<int>_>);
  }
  return iVar20;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}